

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::clone_from(Mat *this,Mat *mat,Allocator *allocator)

{
  int *piVar1;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  Mat *in_RDI;
  void *in_R8;
  Mat local_d8;
  Mat *local_78;
  int local_68;
  undefined4 local_64;
  Mat *local_60;
  int local_48;
  undefined4 local_44;
  int local_28;
  undefined4 local_24;
  Mat *local_20;
  void *local_8;
  
  clone(&local_d8,in_RSI,in_RDX,in_ECX,in_R8);
  local_60 = &local_d8;
  if (in_RDI != local_60) {
    if (local_d8.refcount != (int *)0x0) {
      local_64 = 1;
      LOCK();
      local_68 = *local_d8.refcount;
      *local_d8.refcount = *local_d8.refcount + 1;
      UNLOCK();
    }
    if (in_RDI->refcount != (int *)0x0) {
      piVar1 = in_RDI->refcount;
      local_44 = 0xffffffff;
      LOCK();
      local_48 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_48 == 1) {
        if (in_RDI->allocator == (Allocator *)0x0) {
          local_8 = in_RDI->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (*in_RDI->allocator->_vptr_Allocator[3])(in_RDI->allocator,in_RDI->data);
        }
      }
    }
    in_RDI->data = (void *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->data = local_60->data;
    in_RDI->refcount = local_60->refcount;
    in_RDI->elemsize = local_60->elemsize;
    in_RDI->elempack = local_60->elempack;
    in_RDI->allocator = local_60->allocator;
    in_RDI->dims = local_60->dims;
    in_RDI->w = local_60->w;
    in_RDI->h = local_60->h;
    in_RDI->d = local_60->d;
    in_RDI->c = local_60->c;
    in_RDI->cstep = local_60->cstep;
  }
  local_78 = &local_d8;
  if (local_d8.refcount != (int *)0x0) {
    local_24 = 0xffffffff;
    LOCK();
    local_28 = *local_d8.refcount;
    *local_d8.refcount = *local_d8.refcount + -1;
    UNLOCK();
    if (local_28 == 1) {
      local_20 = local_78;
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])(local_d8.allocator,local_d8.data);
      }
    }
  }
  return;
}

Assistant:

void Mat::clone_from(const ncnn::Mat& mat, Allocator* allocator)
{
    *this = mat.clone(allocator);
}